

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O2

void anon_unknown.dwarf_423e469::sha512::Transform(uint64_t *s,uchar *chunk)

{
  uint64_t a_00;
  uint64_t b_00;
  uint64_t c_00;
  uint64_t uVar1;
  uint64_t e_00;
  uint64_t f_00;
  uint64_t g_00;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong w;
  ulong w_00;
  ulong w_01;
  ulong w_02;
  ulong w_03;
  ulong w_04;
  ulong w_05;
  ulong w_06;
  ulong w_07;
  ulong w_08;
  ulong w_09;
  ulong w_10;
  ulong w_11;
  ulong w_12;
  ulong uVar27;
  ulong w_13;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  a_00 = *s;
  b_00 = s[1];
  c_00 = s[2];
  uVar1 = s[3];
  e_00 = s[4];
  f_00 = s[5];
  g_00 = s[6];
  uVar2 = s[7];
  uVar12 = *(ulong *)chunk;
  uVar11 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18
           | (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18
           | (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  h = uVar2;
  g = g_00;
  f = f_00;
  e = e_00;
  d = uVar1;
  c = c_00;
  b = b_00;
  a = a_00;
  Round(a_00,b_00,c_00,&d,e_00,f_00,g_00,&h,0x428a2f98d728ae22,uVar11);
  uVar6 = d;
  uVar3 = h;
  uVar12 = *(ulong *)(chunk + 8);
  uVar14 = uVar12 >> 0x38;
  w = uVar14 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
      (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
      (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(h,a_00,b_00,&c,d,e_00,f_00,&g,0x7137449123ef65cd,w);
  uVar7 = c;
  uVar4 = g;
  uVar12 = *(ulong *)(chunk + 0x10);
  uVar15 = uVar12 >> 0x38;
  w_00 = uVar15 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(g,uVar3,a_00,&b,c,uVar6,e_00,&f,0xb5c0fbcfec4d3b2f,w_00);
  uVar8 = b;
  uVar5 = f;
  uVar12 = *(ulong *)(chunk + 0x18);
  uVar16 = uVar12 >> 0x38;
  w_01 = uVar16 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(f,uVar4,uVar3,&a,b,uVar7,uVar6,&e,0xe9b5dba58189dbbc,w_01);
  uVar9 = a;
  uVar6 = e;
  uVar12 = *(ulong *)(chunk + 0x20);
  uVar17 = uVar12 >> 0x38;
  w_02 = uVar17 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(e,uVar5,uVar4,&h,a,uVar8,uVar7,&d,0x3956c25bf348b538,w_02);
  uVar7 = d;
  uVar3 = h;
  uVar12 = *(ulong *)(chunk + 0x28);
  uVar18 = uVar12 >> 0x38;
  w_03 = uVar18 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(d,uVar6,uVar5,&g,h,uVar9,uVar8,&c,0x59f111f1b605d019,w_03);
  uVar8 = c;
  uVar4 = g;
  uVar12 = *(ulong *)(chunk + 0x30);
  uVar19 = uVar12 >> 0x38;
  w_04 = uVar19 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar9,&b,0x923f82a4af194f9b,w_04);
  uVar9 = b;
  uVar5 = f;
  uVar12 = *(ulong *)(chunk + 0x38);
  uVar20 = uVar12 >> 0x38;
  w_05 = uVar20 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0xab1c5ed5da6d8118,w_05);
  uVar10 = a;
  uVar6 = e;
  uVar12 = *(ulong *)(chunk + 0x40);
  uVar21 = uVar12 >> 0x38;
  w_06 = uVar21 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0xd807aa98a3030242,w_06);
  uVar7 = d;
  uVar3 = h;
  uVar12 = *(ulong *)(chunk + 0x48);
  uVar22 = uVar12 >> 0x38;
  w_07 = uVar22 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0x12835b0145706fbe,w_07);
  uVar8 = c;
  uVar4 = g;
  uVar12 = *(ulong *)(chunk + 0x50);
  uVar23 = uVar12 >> 0x38;
  w_08 = uVar23 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0x243185be4ee4b28c,w_08);
  uVar9 = b;
  uVar5 = f;
  uVar12 = *(ulong *)(chunk + 0x58);
  uVar24 = uVar12 >> 0x38;
  w_09 = uVar24 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0x550c7dc3d5ffb4e2,w_09);
  uVar10 = a;
  uVar6 = e;
  uVar12 = *(ulong *)(chunk + 0x60);
  uVar25 = uVar12 >> 0x38;
  w_10 = uVar25 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x72be5d74f27b896f,w_10);
  uVar7 = d;
  uVar3 = h;
  uVar12 = *(ulong *)(chunk + 0x68);
  uVar26 = uVar12 >> 0x38;
  w_11 = uVar26 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18 |
         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
         (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0x80deb1fe3b1696b1,w_11);
  uVar8 = c;
  uVar4 = g;
  uVar12 = *(ulong *)(chunk + 0x70);
  uVar29 = uVar12 >> 0x38;
  uVar27 = uVar29 | (uVar12 & 0xff000000000000) >> 0x28 | (uVar12 & 0xff0000000000) >> 0x18;
  w_12 = uVar27 | (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 |
         (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x9bdc06a725c71235,w_12);
  uVar9 = b;
  uVar5 = f;
  uVar13 = *(ulong *)(chunk + 0x78);
  uVar30 = uVar13 >> 0x38;
  uVar28 = uVar30 | (uVar13 & 0xff000000000000) >> 0x28 | (uVar13 & 0xff0000000000) >> 0x18;
  w_13 = uVar28 | (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 |
         (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38;
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0xc19bf174cf692694,w_13);
  uVar10 = a;
  uVar6 = e;
  uVar12 = uVar11 + w_07 +
           (w >> 7 ^ (uVar14 << 0x38 | w >> 8) ^ (w >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           (w_12 >> 6 ^ (w_12 << 3 | (uVar12 << 0x38) >> 0x3d) ^ (uVar27 << 0x2d | w_12 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0xe49b69c19ef14ad2,uVar12);
  uVar7 = d;
  uVar3 = h;
  uVar13 = w + w_08 +
           (w_00 >> 7 ^
           (uVar15 << 0x38 | w_00 >> 8) ^ (w_00 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           (w_13 >> 6 ^ (w_13 << 3 | (uVar13 << 0x38) >> 0x3d) ^ (uVar28 << 0x2d | w_13 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0xefbe4786384f25e3,uVar13);
  uVar8 = c;
  uVar4 = g;
  uVar14 = w_00 + w_09 +
           (w_01 >> 7 ^
           (uVar16 << 0x38 | w_01 >> 8) ^ (w_01 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0xfc19dc68b8cd5b5,uVar14);
  uVar9 = b;
  uVar5 = f;
  uVar15 = w_01 + w_10 +
           (w_02 >> 7 ^
           (uVar17 << 0x38 | w_02 >> 8) ^ (w_02 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0x240ca1cc77ac9c65,uVar15);
  uVar10 = a;
  uVar6 = e;
  uVar28 = w_02 + w_11 +
           (w_03 >> 7 ^
           (uVar18 << 0x38 | w_03 >> 8) ^ (w_03 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x2de92c6f592b0275,uVar28);
  uVar7 = d;
  uVar3 = h;
  uVar16 = w_03 + w_12 +
           (w_04 >> 7 ^
           (uVar19 << 0x38 | w_04 >> 8) ^ (w_04 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0x4a7484aa6ea6e483,uVar16);
  uVar8 = c;
  uVar4 = g;
  uVar17 = w_04 + w_13 +
           (w_05 >> 7 ^
           (uVar20 << 0x38 | w_05 >> 8) ^ (w_05 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           (uVar28 >> 6 ^ (uVar28 * 8 | uVar28 >> 0x3d) ^ (uVar28 << 0x2d | uVar28 >> 0x13));
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x5cb0a9dcbd41fbd4,uVar17);
  uVar9 = b;
  uVar5 = f;
  uVar27 = (w_06 >> 7 ^
           (uVar21 << 0x38 | w_06 >> 8) ^ (w_06 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) + w_05 +
           uVar12 + (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13)
                    );
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x76f988da831153b5,uVar27);
  uVar10 = a;
  uVar6 = e;
  uVar18 = (w_07 >> 7 ^
           (uVar22 << 0x38 | w_07 >> 8) ^ (w_07 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) + w_06 +
           uVar13 + (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13)
                    );
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0x983e5152ee66dfab,uVar18);
  uVar7 = d;
  uVar3 = h;
  uVar19 = (w_08 >> 7 ^
           (uVar23 << 0x38 | w_08 >> 8) ^ (w_08 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) + w_07 +
           uVar14 + (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13)
                    );
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0xa831c66d2db43210,uVar19);
  uVar8 = c;
  uVar4 = g;
  uVar11 = (w_09 >> 7 ^
           (uVar24 << 0x38 | w_09 >> 8) ^ (w_09 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) + w_08 +
           uVar15 + (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13)
                    );
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0xb00327c898fb213f,uVar11);
  uVar9 = b;
  uVar5 = f;
  uVar20 = (w_10 >> 7 ^
           (uVar25 << 0x38 | w_10 >> 8) ^ (w_10 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) + w_09 +
           uVar28 + (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13)
                    );
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0xbf597fc7beef0ee4,uVar20);
  uVar10 = a;
  uVar6 = e;
  uVar21 = (w_11 >> 7 ^
           (uVar26 << 0x38 | w_11 >> 8) ^ (w_11 >> 1 | (ulong)((uVar26 & 1) != 0) << 0x3f)) + w_10 +
           uVar16 + (uVar11 >> 6 ^ (uVar11 * 8 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13)
                    );
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0xc6e00bf33da88fc2,uVar21);
  uVar7 = d;
  uVar3 = h;
  uVar24 = (w_12 >> 7 ^
           (uVar29 << 0x38 | w_12 >> 8) ^ (w_12 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) + w_11 +
           uVar17 + (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13)
                    );
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0xd5a79147930aa725,uVar24);
  uVar8 = c;
  uVar4 = g;
  uVar22 = (w_13 >> 7 ^
           (uVar30 << 0x38 | w_13 >> 8) ^ (w_13 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) + w_12 +
           uVar27 + (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13)
                    );
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x6ca6351e003826f,uVar22);
  uVar9 = b;
  uVar5 = f;
  uVar23 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           w_13 + uVar18 +
           (uVar24 >> 6 ^ (uVar24 * 8 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x142929670a0e6e70,uVar23);
  uVar10 = a;
  uVar6 = e;
  uVar29 = (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar12 + uVar19 +
           (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0x27b70a8546d22ffc,uVar29);
  uVar7 = d;
  uVar3 = h;
  uVar12 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar13 + uVar11 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0x2e1b21385c26c926,uVar12);
  uVar8 = c;
  uVar4 = g;
  uVar13 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           uVar14 + uVar20 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0x4d2c6dfc5ac42aed,uVar13);
  uVar9 = b;
  uVar5 = f;
  uVar25 = (uVar28 >> 7 ^
           (uVar28 << 0x38 | uVar28 >> 8) ^ (uVar28 >> 1 | (ulong)((uVar28 & 1) != 0) << 0x3f)) +
           uVar15 + uVar21 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0x53380d139d95b3df,uVar25);
  uVar10 = a;
  uVar6 = e;
  uVar14 = (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           uVar28 + uVar24 +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x650a73548baf63de,uVar14);
  uVar7 = d;
  uVar3 = h;
  uVar15 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar16 + uVar22 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0x766a0abb3c77b2a8,uVar15);
  uVar8 = c;
  uVar4 = g;
  uVar30 = (uVar27 >> 7 ^
           (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar17 + uVar23 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x81c2c92e47edaee6,uVar30);
  uVar9 = b;
  uVar5 = f;
  uVar16 = (uVar18 >> 7 ^
           (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           uVar27 + uVar29 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x92722c851482353b,uVar16);
  uVar10 = a;
  uVar6 = e;
  uVar17 = (uVar19 >> 7 ^
           (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           uVar18 + uVar12 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0xa2bfe8a14cf10364,uVar17);
  uVar7 = d;
  uVar3 = h;
  uVar26 = (uVar11 >> 7 ^
           (uVar11 << 0x38 | uVar11 >> 8) ^ (uVar11 >> 1 | (ulong)((uVar11 & 1) != 0) << 0x3f)) +
           uVar19 + uVar13 +
           (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0xa81a664bbc423001,uVar26);
  uVar8 = c;
  uVar4 = g;
  uVar18 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar11 + uVar25 +
           (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0xc24b8b70d0f89791,uVar18);
  uVar9 = b;
  uVar5 = f;
  uVar19 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar20 + uVar14 +
           (uVar26 >> 6 ^ (uVar26 * 8 | uVar26 >> 0x3d) ^ (uVar26 << 0x2d | uVar26 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0xc76c51a30654be30,uVar19);
  uVar10 = a;
  uVar6 = e;
  uVar27 = (uVar24 >> 7 ^
           (uVar24 << 0x38 | uVar24 >> 8) ^ (uVar24 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) +
           uVar21 + uVar15 +
           (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0xd192e819d6ef5218,uVar27);
  uVar7 = d;
  uVar3 = h;
  uVar20 = (uVar22 >> 7 ^
           (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
           uVar24 + uVar30 +
           (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0xd69906245565a910,uVar20);
  uVar8 = c;
  uVar4 = g;
  uVar21 = (uVar23 >> 7 ^
           (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
           uVar22 + uVar16 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0xf40e35855771202a,uVar21);
  uVar9 = b;
  uVar5 = f;
  uVar23 = (uVar29 >> 7 ^
           (uVar29 << 0x38 | uVar29 >> 8) ^ (uVar29 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) +
           uVar23 + uVar17 +
           (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x106aa07032bbd1b8,uVar23);
  uVar10 = a;
  uVar6 = e;
  uVar22 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar29 + uVar26 +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0x19a4c116b8d2d0c8,uVar22);
  uVar7 = d;
  uVar3 = h;
  uVar12 = (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar12 + uVar18 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0x1e376c085141ab53,uVar12);
  uVar8 = c;
  uVar4 = g;
  uVar29 = (uVar25 >> 7 ^
           (uVar25 << 0x38 | uVar25 >> 8) ^ (uVar25 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) +
           uVar13 + uVar19 +
           (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0x2748774cdf8eeb99,uVar29);
  uVar9 = b;
  uVar5 = f;
  uVar13 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar25 + uVar27 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0x34b0bcb5e19b48a8,uVar13);
  uVar10 = a;
  uVar6 = e;
  uVar14 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           uVar14 + uVar20 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x391c0cb3c5c95a63,uVar14);
  uVar7 = d;
  uVar3 = h;
  uVar24 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar15 + uVar21 +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0x4ed8aa4ae3418acb,uVar24);
  uVar8 = c;
  uVar4 = g;
  uVar15 = (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           uVar30 + uVar23 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x5b9cca4f7763e373,uVar15);
  uVar9 = b;
  uVar5 = f;
  uVar16 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar16 + uVar22 +
           (uVar24 >> 6 ^ (uVar24 * 8 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x682e6ff3d6b2b8a3,uVar16);
  uVar10 = a;
  uVar6 = e;
  uVar30 = (uVar26 >> 7 ^
           (uVar26 << 0x38 | uVar26 >> 8) ^ (uVar26 >> 1 | (ulong)((uVar26 & 1) != 0) << 0x3f)) +
           uVar17 + uVar12 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0x748f82ee5defb2fc,uVar30);
  uVar7 = d;
  uVar3 = h;
  uVar17 = (uVar18 >> 7 ^
           (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           uVar26 + uVar29 +
           (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0x78a5636f43172f60,uVar17);
  uVar8 = c;
  uVar4 = g;
  uVar18 = (uVar19 >> 7 ^
           (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           uVar18 + uVar13 +
           (uVar30 >> 6 ^ (uVar30 * 8 | uVar30 >> 0x3d) ^ (uVar30 << 0x2d | uVar30 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0x84c87814a1f0ab72,uVar18);
  uVar9 = b;
  uVar5 = f;
  uVar25 = (uVar27 >> 7 ^
           (uVar27 << 0x38 | uVar27 >> 8) ^ (uVar27 >> 1 | (ulong)((uVar27 & 1) != 0) << 0x3f)) +
           uVar19 + uVar14 +
           (uVar17 >> 6 ^ (uVar17 * 8 | uVar17 >> 0x3d) ^ (uVar17 << 0x2d | uVar17 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0x8cc702081a6439ec,uVar25);
  uVar10 = a;
  uVar6 = e;
  uVar19 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar27 + uVar24 +
           (uVar18 >> 6 ^ (uVar18 * 8 | uVar18 >> 0x3d) ^ (uVar18 << 0x2d | uVar18 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x90befffa23631e28,uVar19);
  uVar7 = d;
  uVar3 = h;
  uVar20 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar20 + uVar15 +
           (uVar25 >> 6 ^ (uVar25 * 8 | uVar25 >> 0x3d) ^ (uVar25 << 0x2d | uVar25 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0xa4506cebde82bde9,uVar20);
  uVar8 = c;
  uVar4 = g;
  uVar21 = (uVar23 >> 7 ^
           (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
           uVar21 + uVar16 +
           (uVar19 >> 6 ^ (uVar19 * 8 | uVar19 >> 0x3d) ^ (uVar19 << 0x2d | uVar19 >> 0x13));
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0xbef9a3f7b2c67915,uVar21);
  uVar9 = b;
  uVar5 = f;
  uVar23 = (uVar22 >> 7 ^
           (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
           uVar23 + uVar30 +
           (uVar20 >> 6 ^ (uVar20 * 8 | uVar20 >> 0x3d) ^ (uVar20 << 0x2d | uVar20 >> 0x13));
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0xc67178f2e372532b,uVar23);
  uVar10 = a;
  uVar6 = e;
  uVar22 = (uVar12 >> 7 ^
           (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
           uVar22 + uVar17 +
           (uVar21 >> 6 ^ (uVar21 * 8 | uVar21 >> 0x3d) ^ (uVar21 << 0x2d | uVar21 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0xca273eceea26619c,uVar22);
  uVar7 = d;
  uVar3 = h;
  uVar27 = (uVar29 >> 7 ^
           (uVar29 << 0x38 | uVar29 >> 8) ^ (uVar29 >> 1 | (ulong)((uVar29 & 1) != 0) << 0x3f)) +
           uVar12 + uVar18 +
           (uVar23 >> 6 ^ (uVar23 * 8 | uVar23 >> 0x3d) ^ (uVar23 << 0x2d | uVar23 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0xd186b8c721c0c207,uVar27);
  uVar8 = c;
  uVar4 = g;
  uVar28 = (uVar13 >> 7 ^
           (uVar13 << 0x38 | uVar13 >> 8) ^ (uVar13 >> 1 | (ulong)((uVar13 & 1) != 0) << 0x3f)) +
           uVar29 + uVar25 +
           (uVar22 >> 6 ^ (uVar22 * 8 | uVar22 >> 0x3d) ^ (uVar22 << 0x2d | uVar22 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0xeada7dd6cde0eb1e,uVar28);
  uVar9 = b;
  uVar5 = f;
  uVar26 = (uVar14 >> 7 ^
           (uVar14 << 0x38 | uVar14 >> 8) ^ (uVar14 >> 1 | (ulong)((uVar14 & 1) != 0) << 0x3f)) +
           uVar13 + uVar19 +
           (uVar27 >> 6 ^ (uVar27 * 8 | uVar27 >> 0x3d) ^ (uVar27 << 0x2d | uVar27 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0xf57d4f7fee6ed178,uVar26);
  uVar10 = a;
  uVar6 = e;
  uVar12 = (uVar24 >> 7 ^
           (uVar24 << 0x38 | uVar24 >> 8) ^ (uVar24 >> 1 | (ulong)((uVar24 & 1) != 0) << 0x3f)) +
           uVar14 + uVar20 +
           (uVar28 >> 6 ^ (uVar28 * 8 | uVar28 >> 0x3d) ^ (uVar28 << 0x2d | uVar28 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x6f067aa72176fba,uVar12);
  uVar7 = d;
  uVar3 = h;
  uVar24 = (uVar15 >> 7 ^
           (uVar15 << 0x38 | uVar15 >> 8) ^ (uVar15 >> 1 | (ulong)((uVar15 & 1) != 0) << 0x3f)) +
           uVar24 + uVar21 +
           (uVar26 >> 6 ^ (uVar26 * 8 | uVar26 >> 0x3d) ^ (uVar26 << 0x2d | uVar26 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0xa637dc5a2c898a6,uVar24);
  uVar8 = c;
  uVar4 = g;
  uVar29 = (uVar16 >> 7 ^
           (uVar16 << 0x38 | uVar16 >> 8) ^ (uVar16 >> 1 | (ulong)((uVar16 & 1) != 0) << 0x3f)) +
           uVar15 + uVar23 +
           (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13));
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x113f9804bef90dae,uVar29);
  uVar9 = b;
  uVar5 = f;
  uVar13 = (uVar30 >> 7 ^
           (uVar30 << 0x38 | uVar30 >> 8) ^ (uVar30 >> 1 | (ulong)((uVar30 & 1) != 0) << 0x3f)) +
           uVar16 + uVar22 +
           (uVar24 >> 6 ^ (uVar24 * 8 | uVar24 >> 0x3d) ^ (uVar24 << 0x2d | uVar24 >> 0x13));
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x1b710b35131c471b,uVar13);
  uVar10 = a;
  uVar6 = e;
  uVar14 = (uVar17 >> 7 ^
           (uVar17 << 0x38 | uVar17 >> 8) ^ (uVar17 >> 1 | (ulong)((uVar17 & 1) != 0) << 0x3f)) +
           uVar30 + uVar27 +
           (uVar29 >> 6 ^ (uVar29 * 8 | uVar29 >> 0x3d) ^ (uVar29 << 0x2d | uVar29 >> 0x13));
  Round(a,uVar9,uVar8,&d,e,uVar5,uVar4,&h,0x28db77f523047d84,uVar14);
  uVar7 = d;
  uVar3 = h;
  uVar15 = (uVar18 >> 7 ^
           (uVar18 << 0x38 | uVar18 >> 8) ^ (uVar18 >> 1 | (ulong)((uVar18 & 1) != 0) << 0x3f)) +
           uVar17 + uVar28 +
           (uVar13 >> 6 ^ (uVar13 * 8 | uVar13 >> 0x3d) ^ (uVar13 << 0x2d | uVar13 >> 0x13));
  Round(h,uVar10,uVar9,&c,d,uVar6,uVar5,&g,0x32caab7b40c72493,uVar15);
  uVar8 = c;
  uVar4 = g;
  uVar16 = (uVar25 >> 7 ^
           (uVar25 << 0x38 | uVar25 >> 8) ^ (uVar25 >> 1 | (ulong)((uVar25 & 1) != 0) << 0x3f)) +
           uVar18 + uVar26 +
           (uVar14 >> 6 ^ (uVar14 * 8 | uVar14 >> 0x3d) ^ (uVar14 << 0x2d | uVar14 >> 0x13));
  Round(g,uVar3,uVar10,&b,c,uVar7,uVar6,&f,0x3c9ebe0a15c9bebc,uVar16);
  uVar9 = b;
  uVar5 = f;
  uVar15 = (uVar19 >> 7 ^
           (uVar19 << 0x38 | uVar19 >> 8) ^ (uVar19 >> 1 | (ulong)((uVar19 & 1) != 0) << 0x3f)) +
           uVar25 + uVar12 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(f,uVar4,uVar3,&a,b,uVar8,uVar7,&e,0x431d67c49c100d4c,uVar15);
  uVar10 = a;
  uVar6 = e;
  uVar12 = (uVar20 >> 7 ^
           (uVar20 << 0x38 | uVar20 >> 8) ^ (uVar20 >> 1 | (ulong)((uVar20 & 1) != 0) << 0x3f)) +
           uVar19 + uVar24 +
           (uVar16 >> 6 ^ (uVar16 * 8 | uVar16 >> 0x3d) ^ (uVar16 << 0x2d | uVar16 >> 0x13));
  Round(e,uVar5,uVar4,&h,a,uVar9,uVar8,&d,0x4cc5d4becb3e42b6,uVar12);
  uVar7 = d;
  uVar3 = h;
  uVar15 = (uVar21 >> 7 ^
           (uVar21 << 0x38 | uVar21 >> 8) ^ (uVar21 >> 1 | (ulong)((uVar21 & 1) != 0) << 0x3f)) +
           uVar20 + uVar29 +
           (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13));
  Round(d,uVar6,uVar5,&g,h,uVar10,uVar9,&c,0x597f299cfc657e2a,uVar15);
  uVar8 = c;
  uVar4 = g;
  Round(c,uVar7,uVar6,&f,g,uVar3,uVar10,&b,0x5fcb6fab3ad6faec,
        (uVar23 >> 7 ^
        (uVar23 << 0x38 | uVar23 >> 8) ^ (uVar23 >> 1 | (ulong)((uVar23 & 1) != 0) << 0x3f)) +
        uVar21 + uVar13 +
        (uVar12 >> 6 ^ (uVar12 * 8 | uVar12 >> 0x3d) ^ (uVar12 << 0x2d | uVar12 >> 0x13)));
  uVar6 = b;
  uVar5 = f;
  Round(b,uVar8,uVar7,&e,f,uVar4,uVar3,&a,0x6c44198c4a475817,
        (uVar22 >> 7 ^
        (uVar22 << 0x38 | uVar22 >> 8) ^ (uVar22 >> 1 | (ulong)((uVar22 & 1) != 0) << 0x3f)) +
        uVar23 + uVar14 +
        (uVar15 >> 6 ^ (uVar15 * 8 | uVar15 >> 0x3d) ^ (uVar15 << 0x2d | uVar15 >> 0x13)));
  *s = a_00 + a;
  s[1] = uVar6 + b_00;
  s[2] = uVar8 + c_00;
  s[3] = uVar7 + uVar1;
  s[4] = e_00 + e;
  s[5] = uVar5 + f_00;
  s[6] = uVar4 + g_00;
  s[7] = uVar3 + uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint64_t* s, const unsigned char* chunk)
{
    uint64_t a = s[0], b = s[1], c = s[2], d = s[3], e = s[4], f = s[5], g = s[6], h = s[7];
    uint64_t w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, 0x428a2f98d728ae22ull, w0 = ReadBE64(chunk + 0));
    Round(h, a, b, c, d, e, f, g, 0x7137449123ef65cdull, w1 = ReadBE64(chunk + 8));
    Round(g, h, a, b, c, d, e, f, 0xb5c0fbcfec4d3b2full, w2 = ReadBE64(chunk + 16));
    Round(f, g, h, a, b, c, d, e, 0xe9b5dba58189dbbcull, w3 = ReadBE64(chunk + 24));
    Round(e, f, g, h, a, b, c, d, 0x3956c25bf348b538ull, w4 = ReadBE64(chunk + 32));
    Round(d, e, f, g, h, a, b, c, 0x59f111f1b605d019ull, w5 = ReadBE64(chunk + 40));
    Round(c, d, e, f, g, h, a, b, 0x923f82a4af194f9bull, w6 = ReadBE64(chunk + 48));
    Round(b, c, d, e, f, g, h, a, 0xab1c5ed5da6d8118ull, w7 = ReadBE64(chunk + 56));
    Round(a, b, c, d, e, f, g, h, 0xd807aa98a3030242ull, w8 = ReadBE64(chunk + 64));
    Round(h, a, b, c, d, e, f, g, 0x12835b0145706fbeull, w9 = ReadBE64(chunk + 72));
    Round(g, h, a, b, c, d, e, f, 0x243185be4ee4b28cull, w10 = ReadBE64(chunk + 80));
    Round(f, g, h, a, b, c, d, e, 0x550c7dc3d5ffb4e2ull, w11 = ReadBE64(chunk + 88));
    Round(e, f, g, h, a, b, c, d, 0x72be5d74f27b896full, w12 = ReadBE64(chunk + 96));
    Round(d, e, f, g, h, a, b, c, 0x80deb1fe3b1696b1ull, w13 = ReadBE64(chunk + 104));
    Round(c, d, e, f, g, h, a, b, 0x9bdc06a725c71235ull, w14 = ReadBE64(chunk + 112));
    Round(b, c, d, e, f, g, h, a, 0xc19bf174cf692694ull, w15 = ReadBE64(chunk + 120));

    Round(a, b, c, d, e, f, g, h, 0xe49b69c19ef14ad2ull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xefbe4786384f25e3ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x0fc19dc68b8cd5b5ull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x240ca1cc77ac9c65ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x2de92c6f592b0275ull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4a7484aa6ea6e483ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5cb0a9dcbd41fbd4ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x76f988da831153b5ull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x983e5152ee66dfabull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa831c66d2db43210ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xb00327c898fb213full, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xbf597fc7beef0ee4ull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xc6e00bf33da88fc2ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd5a79147930aa725ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x06ca6351e003826full, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x142929670a0e6e70ull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x27b70a8546d22ffcull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x2e1b21385c26c926ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x4d2c6dfc5ac42aedull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x53380d139d95b3dfull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x650a73548baf63deull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x766a0abb3c77b2a8ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x81c2c92e47edaee6ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x92722c851482353bull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0xa2bfe8a14cf10364ull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0xa81a664bbc423001ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0xc24b8b70d0f89791ull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0xc76c51a30654be30ull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0xd192e819d6ef5218ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xd69906245565a910ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xf40e35855771202aull, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x106aa07032bbd1b8ull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0x19a4c116b8d2d0c8ull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0x1e376c085141ab53ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0x2748774cdf8eeb99ull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0x34b0bcb5e19b48a8ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x391c0cb3c5c95a63ull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x4ed8aa4ae3418acbull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x5b9cca4f7763e373ull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x682e6ff3d6b2b8a3ull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x748f82ee5defb2fcull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x78a5636f43172f60ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x84c87814a1f0ab72ull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x8cc702081a6439ecull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x90befffa23631e28ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0xa4506cebde82bde9ull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0xbef9a3f7b2c67915ull, w14 += sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0xc67178f2e372532bull, w15 += sigma1(w13) + w8 + sigma0(w0));

    Round(a, b, c, d, e, f, g, h, 0xca273eceea26619cull, w0 += sigma1(w14) + w9 + sigma0(w1));
    Round(h, a, b, c, d, e, f, g, 0xd186b8c721c0c207ull, w1 += sigma1(w15) + w10 + sigma0(w2));
    Round(g, h, a, b, c, d, e, f, 0xeada7dd6cde0eb1eull, w2 += sigma1(w0) + w11 + sigma0(w3));
    Round(f, g, h, a, b, c, d, e, 0xf57d4f7fee6ed178ull, w3 += sigma1(w1) + w12 + sigma0(w4));
    Round(e, f, g, h, a, b, c, d, 0x06f067aa72176fbaull, w4 += sigma1(w2) + w13 + sigma0(w5));
    Round(d, e, f, g, h, a, b, c, 0x0a637dc5a2c898a6ull, w5 += sigma1(w3) + w14 + sigma0(w6));
    Round(c, d, e, f, g, h, a, b, 0x113f9804bef90daeull, w6 += sigma1(w4) + w15 + sigma0(w7));
    Round(b, c, d, e, f, g, h, a, 0x1b710b35131c471bull, w7 += sigma1(w5) + w0 + sigma0(w8));
    Round(a, b, c, d, e, f, g, h, 0x28db77f523047d84ull, w8 += sigma1(w6) + w1 + sigma0(w9));
    Round(h, a, b, c, d, e, f, g, 0x32caab7b40c72493ull, w9 += sigma1(w7) + w2 + sigma0(w10));
    Round(g, h, a, b, c, d, e, f, 0x3c9ebe0a15c9bebcull, w10 += sigma1(w8) + w3 + sigma0(w11));
    Round(f, g, h, a, b, c, d, e, 0x431d67c49c100d4cull, w11 += sigma1(w9) + w4 + sigma0(w12));
    Round(e, f, g, h, a, b, c, d, 0x4cc5d4becb3e42b6ull, w12 += sigma1(w10) + w5 + sigma0(w13));
    Round(d, e, f, g, h, a, b, c, 0x597f299cfc657e2aull, w13 += sigma1(w11) + w6 + sigma0(w14));
    Round(c, d, e, f, g, h, a, b, 0x5fcb6fab3ad6faecull, w14 + sigma1(w12) + w7 + sigma0(w15));
    Round(b, c, d, e, f, g, h, a, 0x6c44198c4a475817ull, w15 + sigma1(w13) + w8 + sigma0(w0));

    s[0] += a;
    s[1] += b;
    s[2] += c;
    s[3] += d;
    s[4] += e;
    s[5] += f;
    s[6] += g;
    s[7] += h;
}